

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20250127::container_internal::operator==(iterator *a,iterator *b)

{
  ctrl_t *pcVar1;
  ctrl_t *pcVar2;
  ctrl_t *pcVar3;
  ctrl_t *pcVar4;
  ctrl_t *pcVar5;
  ctrl_t *pcVar6;
  
  pcVar1 = a->ctrl_;
  if ((pcVar1 == kEmptyGroup + 0x10 || pcVar1 == (ctrl_t *)0x0) || (kSentinel < *pcVar1)) {
    pcVar2 = b->ctrl_;
    if ((pcVar2 == kEmptyGroup + 0x10 || pcVar2 == (ctrl_t *)0x0) || (kSentinel < *pcVar2)) {
      if (pcVar1 == kEmptyGroup + 0x10 && pcVar2 == kEmptyGroup + 0x10) {
LAB_001f5d87:
        return pcVar1 == pcVar2;
      }
      if ((pcVar1 == kEmptyGroup + 0x10) != (pcVar2 == kEmptyGroup + 0x10)) goto LAB_001f5da3;
      if (pcVar1 == (ctrl_t *)0x0 || pcVar2 == (ctrl_t *)0x0) goto LAB_001f5d87;
      if ((pcVar2 == kSooControl) == (pcVar1 == kSooControl)) {
        pcVar3 = (ctrl_t *)(a->field_1).slot_;
        pcVar4 = (ctrl_t *)(b->field_1).slot_;
        if (pcVar1 == kSooControl) {
          if (pcVar3 == pcVar4) goto LAB_001f5d87;
        }
        else {
          pcVar6 = pcVar4;
          pcVar5 = pcVar2;
          if (pcVar2 < pcVar1) {
            pcVar6 = pcVar3;
            pcVar5 = pcVar1;
            pcVar3 = pcVar4;
          }
          if ((pcVar5 < pcVar3) && (pcVar3 <= pcVar6)) goto LAB_001f5d87;
        }
      }
      operator==();
      goto LAB_001f5d99;
    }
  }
  else {
LAB_001f5d99:
    operator==();
  }
  operator==();
LAB_001f5da3:
  operator==();
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }